

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

int __thiscall
array<CSkins::CSkin,_allocator_default<CSkins::CSkin>_>::insert
          (array<CSkins::CSkin,_allocator_default<CSkins::CSkin>_> *this,CSkin *item,range r)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  int new_len;
  
  if (r.begin < r.end) {
    dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/base/tl/range.h"
                   ,0x96,1,"empty");
    iVar2 = (int)((long)r.begin - (long)this->list >> 3) * -0x3d70a3d7;
    uVar1 = this->list_size;
    uVar3 = this->num_elements;
    if (uVar3 == uVar1) {
      uVar1 = 1;
      if (1 < (int)uVar3) {
        uVar1 = uVar3 >> 1;
      }
      alloc(this,uVar1 + uVar3);
      uVar1 = this->list_size;
      uVar3 = this->num_elements;
    }
    new_len = uVar3 + 1;
    if ((int)uVar1 <= (int)uVar3) {
      alloc(this,new_len);
    }
    this->num_elements = new_len;
    if (iVar2 < (int)uVar3) {
      lVar4 = (long)(int)uVar3;
      lVar5 = lVar4 * 200;
      do {
        memcpy(this->list->m_aName + lVar5 + -4,this->list + (long)new_len + -2,200);
        lVar4 = lVar4 + -1;
        new_len = new_len + -1;
        lVar5 = lVar5 + -200;
      } while (iVar2 < lVar4);
    }
    memcpy(this->list + iVar2,item,200);
    return this->num_elements + -1;
  }
  iVar2 = add(this,item);
  return iVar2;
}

Assistant:

int insert(const T& item, range r)
	{
		if(r.empty())
			return add(item);

		int index = (int)(&r.front()-list);
		incsize();
		set_size(size()+1);

		for(int i = num_elements-1; i > index; i--)
			list[i] = list[i-1];

		list[index] = item;

		return num_elements-1;
	}